

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.h
# Opt level: O0

int cgltf_parse_json_ior(jsmntok_t *tokens,int i,uint8_t *json_chunk,cgltf_ior *out_ior)

{
  int iVar1;
  int iVar2;
  cgltf_float cVar3;
  int local_38;
  int j;
  int size;
  cgltf_ior *out_ior_local;
  uint8_t *json_chunk_local;
  int i_local;
  jsmntok_t *tokens_local;
  
  if (tokens[i].type == JSMN_OBJECT) {
    iVar1 = tokens[i].size;
    json_chunk_local._4_4_ = i + 1;
    out_ior->ior = 1.5;
    for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
      if ((tokens[json_chunk_local._4_4_].type != JSMN_STRING) ||
         (tokens[json_chunk_local._4_4_].size == 0)) {
        return -1;
      }
      iVar2 = cgltf_json_strcmp(tokens + json_chunk_local._4_4_,json_chunk,"ior");
      if (iVar2 == 0) {
        cVar3 = cgltf_json_to_float(tokens + (json_chunk_local._4_4_ + 1),json_chunk);
        out_ior->ior = cVar3;
        json_chunk_local._4_4_ = json_chunk_local._4_4_ + 2;
      }
      else {
        json_chunk_local._4_4_ = cgltf_skip_json(tokens,json_chunk_local._4_4_ + 1);
      }
      if (json_chunk_local._4_4_ < 0) {
        return json_chunk_local._4_4_;
      }
    }
    tokens_local._4_4_ = json_chunk_local._4_4_;
  }
  else {
    tokens_local._4_4_ = -1;
  }
  return tokens_local._4_4_;
}

Assistant:

static int cgltf_parse_json_ior(jsmntok_t const* tokens, int i, const uint8_t* json_chunk, cgltf_ior* out_ior)
{
	CGLTF_CHECK_TOKTYPE(tokens[i], JSMN_OBJECT);
	int size = tokens[i].size;
	++i;

	// Default values
	out_ior->ior = 1.5f;

	for (int j = 0; j < size; ++j)
	{
		CGLTF_CHECK_KEY(tokens[i]);

		if (cgltf_json_strcmp(tokens+i, json_chunk, "ior") == 0)
		{
			++i;
			out_ior->ior = cgltf_json_to_float(tokens + i, json_chunk);
			++i;
		}
		else
		{
			i = cgltf_skip_json(tokens, i+1);
		}

		if (i < 0)
		{
			return i;
		}
	}

	return i;
}